

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O0

void Cec_AddClausesMux(Cec_ManSat_t *p,Gia_Obj_t *pNode)

{
  int iVar1;
  int iVar2;
  int v;
  int v_00;
  uint c;
  uint c_00;
  int iVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  int fCompE;
  int fCompT;
  int VarE;
  int VarT;
  int VarI;
  int VarF;
  int RetValue;
  int pLits [4];
  Gia_Obj_t *local_30;
  Gia_Obj_t *pNodeE;
  Gia_Obj_t *pNodeT;
  Gia_Obj_t *pNodeI;
  Gia_Obj_t *pNode_local;
  Cec_ManSat_t *p_local;
  
  pNodeI = pNode;
  pNode_local = (Gia_Obj_t *)p;
  iVar1 = Gia_IsComplement(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Gia_IsComplement( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                  ,0x45,"void Cec_AddClausesMux(Cec_ManSat_t *, Gia_Obj_t *)");
  }
  iVar1 = Gia_ObjIsMuxType(pNodeI);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsMuxType( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                  ,0x46,"void Cec_AddClausesMux(Cec_ManSat_t *, Gia_Obj_t *)");
  }
  pNodeT = Gia_ObjRecognizeMux(pNodeI,&pNodeE,&local_30);
  iVar1 = Cec_ObjSatNum((Cec_ManSat_t *)pNode_local,pNodeI);
  iVar2 = Cec_ObjSatNum((Cec_ManSat_t *)pNode_local,pNodeT);
  pGVar5 = pNode_local;
  pGVar4 = Gia_Regular(pNodeE);
  v = Cec_ObjSatNum((Cec_ManSat_t *)pGVar5,pGVar4);
  pGVar5 = pNode_local;
  pGVar4 = Gia_Regular(local_30);
  v_00 = Cec_ObjSatNum((Cec_ManSat_t *)pGVar5,pGVar4);
  c = Gia_IsComplement(pNodeE);
  c_00 = Gia_IsComplement(local_30);
  VarF = toLitCond(iVar2,1);
  RetValue = toLitCond(v,c ^ 1);
  pLits[0] = toLitCond(iVar1,0);
  if (*(int *)(*(long *)pNode_local + 0x10) != 0) {
    if (*(long *)pNodeT < 0) {
      VarF = lit_neg(VarF);
    }
    pGVar5 = Gia_Regular(pNodeE);
    if (*(long *)pGVar5 < 0) {
      RetValue = lit_neg(RetValue);
    }
    if (*(long *)pNodeI < 0) {
      pLits[0] = lit_neg(pLits[0]);
    }
  }
  iVar3 = sat_solver_addclause(*(sat_solver **)(pNode_local + 2),&VarF,pLits + 1);
  if (iVar3 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                  ,100,"void Cec_AddClausesMux(Cec_ManSat_t *, Gia_Obj_t *)");
  }
  VarF = toLitCond(iVar2,1);
  RetValue = toLitCond(v,c);
  pLits[0] = toLitCond(iVar1,1);
  if (*(int *)(*(long *)pNode_local + 0x10) != 0) {
    if (*(long *)pNodeT < 0) {
      VarF = lit_neg(VarF);
    }
    pGVar5 = Gia_Regular(pNodeE);
    if (*(long *)pGVar5 < 0) {
      RetValue = lit_neg(RetValue);
    }
    if (*(long *)pNodeI < 0) {
      pLits[0] = lit_neg(pLits[0]);
    }
  }
  iVar3 = sat_solver_addclause(*(sat_solver **)(pNode_local + 2),&VarF,pLits + 1);
  if (iVar3 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                  ,0x6f,"void Cec_AddClausesMux(Cec_ManSat_t *, Gia_Obj_t *)");
  }
  VarF = toLitCond(iVar2,0);
  RetValue = toLitCond(v_00,c_00 ^ 1);
  pLits[0] = toLitCond(iVar1,0);
  if (*(int *)(*(long *)pNode_local + 0x10) != 0) {
    if (*(long *)pNodeT < 0) {
      VarF = lit_neg(VarF);
    }
    pGVar5 = Gia_Regular(local_30);
    if (*(long *)pGVar5 < 0) {
      RetValue = lit_neg(RetValue);
    }
    if (*(long *)pNodeI < 0) {
      pLits[0] = lit_neg(pLits[0]);
    }
  }
  iVar3 = sat_solver_addclause(*(sat_solver **)(pNode_local + 2),&VarF,pLits + 1);
  if (iVar3 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                  ,0x7a,"void Cec_AddClausesMux(Cec_ManSat_t *, Gia_Obj_t *)");
  }
  VarF = toLitCond(iVar2,0);
  RetValue = toLitCond(v_00,c_00);
  pLits[0] = toLitCond(iVar1,1);
  if (*(int *)(*(long *)pNode_local + 0x10) != 0) {
    if (*(long *)pNodeT < 0) {
      VarF = lit_neg(VarF);
    }
    pGVar5 = Gia_Regular(local_30);
    if (*(long *)pGVar5 < 0) {
      RetValue = lit_neg(RetValue);
    }
    if (*(long *)pNodeI < 0) {
      pLits[0] = lit_neg(pLits[0]);
    }
  }
  iVar2 = sat_solver_addclause(*(sat_solver **)(pNode_local + 2),&VarF,pLits + 1);
  if (iVar2 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                  ,0x85,"void Cec_AddClausesMux(Cec_ManSat_t *, Gia_Obj_t *)");
  }
  if (v != v_00) {
    VarF = toLitCond(v,c);
    RetValue = toLitCond(v_00,c_00);
    pLits[0] = toLitCond(iVar1,1);
    if (*(int *)(*(long *)pNode_local + 0x10) != 0) {
      pGVar5 = Gia_Regular(pNodeE);
      if (*(long *)pGVar5 < 0) {
        VarF = lit_neg(VarF);
      }
      pGVar5 = Gia_Regular(local_30);
      if (*(long *)pGVar5 < 0) {
        RetValue = lit_neg(RetValue);
      }
      if (*(long *)pNodeI < 0) {
        pLits[0] = lit_neg(pLits[0]);
      }
    }
    iVar2 = sat_solver_addclause(*(sat_solver **)(pNode_local + 2),&VarF,pLits + 1);
    if (iVar2 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                    ,0x9e,"void Cec_AddClausesMux(Cec_ManSat_t *, Gia_Obj_t *)");
    }
    VarF = toLitCond(v,c ^ 1);
    RetValue = toLitCond(v_00,c_00 ^ 1);
    pLits[0] = toLitCond(iVar1,0);
    if (*(int *)(*(long *)pNode_local + 0x10) != 0) {
      pGVar5 = Gia_Regular(pNodeE);
      if (*(long *)pGVar5 < 0) {
        VarF = lit_neg(VarF);
      }
      pGVar5 = Gia_Regular(local_30);
      if (*(long *)pGVar5 < 0) {
        RetValue = lit_neg(RetValue);
      }
      if (*(long *)pNodeI < 0) {
        pLits[0] = lit_neg(pLits[0]);
      }
    }
    iVar1 = sat_solver_addclause(*(sat_solver **)(pNode_local + 2),&VarF,pLits + 1);
    if (iVar1 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                    ,0xa9,"void Cec_AddClausesMux(Cec_ManSat_t *, Gia_Obj_t *)");
    }
  }
  return;
}

Assistant:

void Cec_AddClausesMux( Cec_ManSat_t * p, Gia_Obj_t * pNode )
{
    Gia_Obj_t * pNodeI, * pNodeT, * pNodeE;
    int pLits[4], RetValue, VarF, VarI, VarT, VarE, fCompT, fCompE;

    assert( !Gia_IsComplement( pNode ) );
    assert( Gia_ObjIsMuxType( pNode ) );
    // get nodes (I = if, T = then, E = else)
    pNodeI = Gia_ObjRecognizeMux( pNode, &pNodeT, &pNodeE );
    // get the variable numbers
    VarF = Cec_ObjSatNum(p,pNode);
    VarI = Cec_ObjSatNum(p,pNodeI);
    VarT = Cec_ObjSatNum(p,Gia_Regular(pNodeT));
    VarE = Cec_ObjSatNum(p,Gia_Regular(pNodeE));
    // get the complementation flags
    fCompT = Gia_IsComplement(pNodeT);
    fCompE = Gia_IsComplement(pNodeE);

    // f = ITE(i, t, e)

    // i' + t' + f
    // i' + t  + f'
    // i  + e' + f
    // i  + e  + f'

    // create four clauses
    pLits[0] = toLitCond(VarI, 1);
    pLits[1] = toLitCond(VarT, 1^fCompT);
    pLits[2] = toLitCond(VarF, 0);
    if ( p->pPars->fPolarFlip )
    {
        if ( pNodeI->fPhase )               pLits[0] = lit_neg( pLits[0] );
        if ( Gia_Regular(pNodeT)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 1);
    pLits[1] = toLitCond(VarT, 0^fCompT);
    pLits[2] = toLitCond(VarF, 1);
    if ( p->pPars->fPolarFlip )
    {
        if ( pNodeI->fPhase )               pLits[0] = lit_neg( pLits[0] );
        if ( Gia_Regular(pNodeT)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 0);
    pLits[1] = toLitCond(VarE, 1^fCompE);
    pLits[2] = toLitCond(VarF, 0);
    if ( p->pPars->fPolarFlip )
    {
        if ( pNodeI->fPhase )               pLits[0] = lit_neg( pLits[0] );
        if ( Gia_Regular(pNodeE)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 0);
    pLits[1] = toLitCond(VarE, 0^fCompE);
    pLits[2] = toLitCond(VarF, 1);
    if ( p->pPars->fPolarFlip )
    {
        if ( pNodeI->fPhase )               pLits[0] = lit_neg( pLits[0] );
        if ( Gia_Regular(pNodeE)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );

    // two additional clauses
    // t' & e' -> f'
    // t  & e  -> f 

    // t  + e   + f'
    // t' + e'  + f 

    if ( VarT == VarE )
    {
//        assert( fCompT == !fCompE );
        return;
    }

    pLits[0] = toLitCond(VarT, 0^fCompT);
    pLits[1] = toLitCond(VarE, 0^fCompE);
    pLits[2] = toLitCond(VarF, 1);
    if ( p->pPars->fPolarFlip )
    {
        if ( Gia_Regular(pNodeT)->fPhase )  pLits[0] = lit_neg( pLits[0] );
        if ( Gia_Regular(pNodeE)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarT, 1^fCompT);
    pLits[1] = toLitCond(VarE, 1^fCompE);
    pLits[2] = toLitCond(VarF, 0);
    if ( p->pPars->fPolarFlip )
    {
        if ( Gia_Regular(pNodeT)->fPhase )  pLits[0] = lit_neg( pLits[0] );
        if ( Gia_Regular(pNodeE)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
}